

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

tool_mime *
tool_mime_new_filedata(tool_mime *parent,char *filename,_Bool isremotefile,CURLcode *errcode)

{
  int iVar1;
  ParameterError PVar2;
  size_t local_f8;
  size_t stdinsize;
  stat sbuf;
  curl_off_t origin;
  curl_off_t size;
  char *data;
  tool_mime *ptStack_40;
  int fd;
  tool_mime *m;
  CURLcode *pCStack_30;
  CURLcode result;
  CURLcode *errcode_local;
  char *pcStack_20;
  _Bool isremotefile_local;
  char *filename_local;
  tool_mime *parent_local;
  
  m._4_4_ = CURLE_OK;
  ptStack_40 = (tool_mime *)0x0;
  *errcode = CURLE_OUT_OF_MEMORY;
  pCStack_30 = errcode;
  errcode_local._7_1_ = isremotefile;
  pcStack_20 = filename;
  filename_local = (char *)parent;
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    data._4_4_ = fileno(_stdin);
    size = 0;
    sbuf.__glibc_reserved[2] = ftell(_stdin);
    if ((((data._4_4_ < 0) || (sbuf.__glibc_reserved[2] < 0)) ||
        (iVar1 = fstat64(data._4_4_,(stat64 *)&stdinsize), iVar1 != 0)) ||
       (((uint)sbuf.st_nlink & 0xf000) != 0x8000)) {
      local_f8 = 0;
      PVar2 = file2memory((char **)&size,&local_f8,(FILE *)_stdin);
      if (PVar2 != PARAM_OK) {
        return ptStack_40;
      }
      iVar1 = ferror(_stdin);
      if (iVar1 == 0) {
        if ((local_f8 == 0) && (size = (curl_off_t)strdup(""), (char *)size == (char *)0x0)) {
          return ptStack_40;
        }
      }
      else {
        m._4_4_ = CURLE_READ_ERROR;
        free((void *)size);
        size = 0;
      }
      origin = curlx_uztoso(local_f8);
      sbuf.__glibc_reserved[2] = 0;
    }
    else {
      origin = sbuf.st_rdev - sbuf.__glibc_reserved[2];
      if (origin < 0) {
        origin = 0;
      }
    }
    ptStack_40 = tool_mime_new((tool_mime *)filename_local,TOOLMIME_STDIN);
    if (ptStack_40 == (tool_mime *)0x0) {
      free((void *)size);
    }
    else {
      ptStack_40->data = (char *)size;
      ptStack_40->origin = sbuf.__glibc_reserved[2];
      ptStack_40->size = origin;
      ptStack_40->curpos = 0;
      if ((errcode_local._7_1_ & 1) == 0) {
        ptStack_40->kind = TOOLMIME_STDINDATA;
      }
      *pCStack_30 = m._4_4_;
    }
  }
  else {
    pcStack_20 = strdup(pcStack_20);
    if (pcStack_20 != (char *)0x0) {
      ptStack_40 = tool_mime_new((tool_mime *)filename_local,TOOLMIME_FILE);
      if (ptStack_40 == (tool_mime *)0x0) {
        free(pcStack_20);
      }
      else {
        ptStack_40->data = pcStack_20;
        if ((errcode_local._7_1_ & 1) == 0) {
          ptStack_40->kind = TOOLMIME_FILEDATA;
        }
        *pCStack_30 = CURLE_OK;
      }
    }
  }
  return ptStack_40;
}

Assistant:

static struct tool_mime *tool_mime_new_filedata(struct tool_mime *parent,
                                                const char *filename,
                                                bool isremotefile,
                                                CURLcode *errcode)
{
  CURLcode result = CURLE_OK;
  struct tool_mime *m = NULL;

  *errcode = CURLE_OUT_OF_MEMORY;
  if(strcmp(filename, "-")) {
    /* This is a normal file. */
    filename = strdup(filename);
    if(filename) {
      m = tool_mime_new(parent, TOOLMIME_FILE);
      if(!m)
        CONST_FREE(filename);
      else {
        m->data = filename;
        if(!isremotefile)
          m->kind = TOOLMIME_FILEDATA;
       *errcode = CURLE_OK;
      }
    }
  }
  else {        /* Standard input. */
    int fd = fileno(stdin);
    char *data = NULL;
    curl_off_t size;
    curl_off_t origin;
    struct_stat sbuf;

    set_binmode(stdin);
    origin = ftell(stdin);
    /* If stdin is a regular file, do not buffer data but read it
       when needed. */
    if(fd >= 0 && origin >= 0 && !fstat(fd, &sbuf) &&
#ifdef __VMS
       sbuf.st_fab_rfm != FAB$C_VAR && sbuf.st_fab_rfm != FAB$C_VFC &&
#endif
       S_ISREG(sbuf.st_mode)) {
      size = sbuf.st_size - origin;
      if(size < 0)
        size = 0;
    }
    else {  /* Not suitable for direct use, buffer stdin data. */
      size_t stdinsize = 0;

      if(file2memory(&data, &stdinsize, stdin) != PARAM_OK) {
        /* Out of memory. */
        return m;
      }

      if(ferror(stdin)) {
        result = CURLE_READ_ERROR;
        Curl_safefree(data);
        data = NULL;
      }
      else if(!stdinsize) {
        /* Zero-length data has been freed. Re-create it. */
        data = strdup("");
        if(!data)
          return m;
      }
      size = curlx_uztoso(stdinsize);
      origin = 0;
    }
    m = tool_mime_new(parent, TOOLMIME_STDIN);
    if(!m)
      Curl_safefree(data);
    else {
      m->data = data;
      m->origin = origin;
      m->size = size;
      m->curpos = 0;
      if(!isremotefile)
        m->kind = TOOLMIME_STDINDATA;
      *errcode = result;
    }
  }
  return m;
}